

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakHash.c
# Opt level: O0

HashReturn Keccak_HashFinal(Keccak_HashInstance *instance,BitSequence *hashval)

{
  HashReturn HVar1;
  size_t in_RDI;
  KeccakWidth1600_SpongeInstance *unaff_retaddr;
  HashReturn ret;
  KeccakWidth1600_SpongeInstance *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  HVar1 = KeccakWidth1600_SpongeAbsorbLastFewBits(in_stack_ffffffffffffffd8,'\0');
  if (HVar1 == SUCCESS) {
    HVar1 = KeccakWidth1600_SpongeSqueeze
                      (unaff_retaddr,
                       (uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                      );
  }
  return HVar1;
}

Assistant:

HashReturn Keccak_HashFinal(Keccak_HashInstance *instance,
                            BitSequence *hashval) {
  HashReturn ret = (HashReturn)KeccakWidth1600_SpongeAbsorbLastFewBits(
      &instance->sponge, instance->delimitedSuffix);
  if (ret == SUCCESS)
    return (HashReturn)KeccakWidth1600_SpongeSqueeze(
        &instance->sponge, hashval, instance->fixedOutputLength / 8);
  else
    return ret;
}